

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

void av1_rd_pick_palette_intra_sby
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int dc_mode_cost,
               MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
               int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
               PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  aom_bit_depth_t bit_depth;
  SequenceHeader *pSVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000011;
  long lVar12;
  ulong uVar13;
  int n;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int16_t *piVar17;
  ulong uVar18;
  byte *src;
  size_t sVar19;
  ulong uVar20;
  uint uVar21;
  byte bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  _Bool local_4531;
  int beat_best_palette_rd;
  uint local_452c;
  AV1_COMP *local_4528;
  int local_451c;
  ulong local_4518;
  ulong local_4510;
  ulong local_4508;
  undefined8 local_4500;
  ulong local_44f8;
  ulong local_44f0;
  int16_t *local_44e8;
  MB_MODE_INFO *local_44e0;
  MB_MODE_INFO *local_44d8;
  MACROBLOCK *local_44d0;
  uint8_t *local_44c8;
  undefined8 local_44c0;
  ulong local_44b8;
  int colors;
  size_t local_44a8;
  ulong local_44a0;
  int colors_threshold;
  ulong local_4490;
  uint8_t *local_4488;
  undefined4 local_4480;
  uint local_447c;
  int16_t top_colors [8];
  uint16_t color_cache [16];
  int count_buf_8bit [256];
  int count_buf [4096];
  
  local_44e0 = *(x->e_mbd).mi;
  local_4480 = (undefined4)CONCAT71(in_register_00000011,bsize);
  uVar18 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = block_size_high[uVar18];
  iVar7 = (x->e_mbd).mb_to_bottom_edge;
  iVar11 = (x->e_mbd).mb_to_right_edge;
  bVar22 = (byte)(x->e_mbd).plane[0].subsampling_x;
  local_447c = (uint)(block_size_wide[uVar18] >> (bVar22 & 0x1f));
  bVar2 = (byte)(x->e_mbd).plane[0].subsampling_y;
  iVar10 = (int)((iVar7 >> 0x1f & iVar7 >> 3) + (uint)bVar1) >> (bVar2 & 0x1f);
  local_452c = (int)((iVar11 >> 0x1f & iVar11 >> 3) + (uint)block_size_wide[uVar18]) >>
               (bVar22 & 0x1f);
  iVar7 = x->plane[0].src.stride;
  pSVar5 = (cpi->common).seq_params;
  uVar3 = pSVar5->use_highbitdepth;
  bit_depth = pSVar5->bit_depth;
  local_44f8 = (ulong)bit_depth;
  src = x->plane[0].src.buf;
  local_44b8 = (ulong)(uint)(cpi->sf).rt_sf.use_nonrd_pick_mode;
  colors_threshold = 0;
  local_4510 = CONCAT44(local_4510._4_4_,iVar10);
  local_4528 = cpi;
  local_451c = dc_mode_cost;
  local_44d8 = best_mbmi;
  local_44c8 = best_palette_color_map;
  if (uVar3 == '\0') {
    av1_count_colors(src,iVar7,iVar10,local_452c,count_buf,&colors);
    colors_threshold = colors;
    cpi = local_4528;
  }
  else {
    av1_count_colors_highbd
              (src,iVar7,iVar10,local_452c,bit_depth,count_buf,count_buf_8bit,&colors_threshold,
               &colors);
  }
  iVar11 = x->color_palette_thresh;
  iVar10 = iVar11;
  if (((((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) &&
       ((cpi->sf).rt_sf.increase_color_thresh_palette == true)) && ((cpi->rc).high_source_sad != 0))
     && (0x32 < x->source_variance)) {
    if (x->color_sensitivity[0] == '\0') {
      if (x->color_sensitivity[1] == '\0') {
        iVar10 = iVar11 + 0x14;
        goto LAB_001e155f;
      }
      lVar12 = x->min_dist_inter_uv;
      bVar22 = ""[uVar18] + ""[uVar18];
    }
    else {
      lVar12 = x->min_dist_inter_uv >> (""[uVar18] + ""[uVar18] & 0x3f);
      bVar22 = x->color_sensitivity[1] != '\0';
    }
    iVar10 = iVar11 + 0x14;
    if (7999 < lVar12 >> (bVar22 & 0x3f)) {
      iVar10 = iVar11;
    }
  }
LAB_001e155f:
  local_4488 = (x->e_mbd).plane[0].color_index_map;
  if ((1 < colors_threshold) && (colors_threshold <= iVar10)) {
    local_44e8 = x->palette_buffer->kmeans_data_buf;
    if (uVar3 == '\0') {
      uVar21 = (uint)*src;
      uVar15 = uVar21;
      if (0 < (int)local_4510) {
        iVar11 = 0;
        uVar21 = (uint)*src;
        piVar17 = local_44e8;
        do {
          if (0 < (int)local_452c) {
            uVar18 = 0;
            uVar8 = uVar15;
            do {
              uVar15 = (uint)src[uVar18];
              if (uVar15 <= uVar21) {
                uVar21 = uVar15;
              }
              piVar17[uVar18] = (ushort)src[uVar18];
              if (uVar15 < uVar8) {
                uVar15 = uVar8;
              }
              uVar18 = uVar18 + 1;
              uVar8 = uVar15;
            } while (local_452c != uVar18);
          }
          src = src + iVar7;
          iVar11 = iVar11 + 1;
          piVar17 = piVar17 + (int)local_452c;
        } while (iVar11 != (int)local_4510);
      }
    }
    else {
      uVar15 = (uint)*(ushort *)((long)src * 2);
      uVar21 = uVar15;
      if (0 < (int)local_4510) {
        lVar12 = (long)src * 2;
        iVar11 = 0;
        uVar21 = (uint)*(ushort *)((long)src * 2);
        piVar17 = local_44e8;
        do {
          if (0 < (int)local_452c) {
            uVar18 = 0;
            uVar8 = uVar15;
            do {
              uVar4 = *(ushort *)(lVar12 + uVar18 * 2);
              uVar15 = (uint)uVar4;
              if (uVar4 <= uVar21) {
                uVar21 = uVar15;
              }
              piVar17[uVar18] = uVar4;
              if (uVar15 < uVar8) {
                uVar15 = uVar8;
              }
              uVar18 = uVar18 + 1;
              uVar8 = uVar15;
            } while (local_452c != uVar18);
          }
          iVar11 = iVar11 + 1;
          piVar17 = piVar17 + (int)local_452c;
          lVar12 = lVar12 + (long)iVar7 * 2;
        } while (iVar11 != (int)local_4510);
      }
    }
    iVar11 = 0;
    local_44e0->mode = '\0';
    (local_44e0->filter_intra_mode_info).use_filter_intra = '\0';
    local_44d0 = x;
    iVar7 = av1_get_palette_cache(&x->e_mbd,0,color_cache);
    local_44c0 = CONCAT44(extraout_var,iVar7);
    top_colors[0] = 0;
    top_colors[1] = 0;
    top_colors[2] = 0;
    top_colors[3] = 0;
    top_colors[4] = 0;
    top_colors[5] = 0;
    top_colors[6] = 0;
    top_colors[7] = 0;
    local_44a0 = CONCAT44(local_44a0._4_4_,colors);
    uVar18 = 8;
    if (colors < 8) {
      uVar18 = (ulong)(uint)colors;
    }
    count_buf_8bit[0xc] = 0;
    count_buf_8bit[0xd] = 0;
    count_buf_8bit[0xe] = 0;
    count_buf_8bit[0xf] = 0;
    count_buf_8bit[8] = 0;
    count_buf_8bit[9] = 0;
    count_buf_8bit[10] = 0;
    count_buf_8bit[0xb] = 0;
    count_buf_8bit[4] = 0;
    count_buf_8bit[5] = 0;
    count_buf_8bit[6] = 0;
    count_buf_8bit[7] = 0;
    count_buf_8bit[0] = 0;
    count_buf_8bit[1] = 0;
    count_buf_8bit[2] = 0;
    count_buf_8bit[3] = 0;
    if ((int)local_44f8 != 0x1f) {
      uVar13 = 1L << ((byte)local_44f8 & 0x3f);
      uVar8 = (int)uVar18 - 1;
      local_4518 = (ulong)uVar8;
      local_44f0 = (ulong)(int)uVar8;
      local_44a8 = (size_t)(int)uVar18;
      local_4508 = CONCAT44(local_4508._4_4_,(int)uVar8 >> 0x1f & uVar8);
      uVar14 = 0;
      local_4500 = uVar13;
      local_44f8 = uVar18;
      do {
        iVar7 = count_buf[uVar14];
        if (0 < iVar7) {
          iVar10 = (int)uVar18;
          if (iVar11 < iVar10) {
            count_buf_8bit[(long)iVar11 * 2] = (int)uVar14;
            count_buf_8bit[(long)iVar11 * 2 + 1] = iVar7;
            iVar11 = iVar11 + 1;
            if (iVar11 == iVar10) {
              qsort(count_buf_8bit,local_44a8,8,color_count_comp);
              iVar11 = (int)local_44f8;
              uVar13 = local_4500;
              uVar18 = local_44f8;
            }
          }
          else if (count_buf_8bit[local_44f0 * 2 + 1] < iVar7) {
            uVar18 = uVar18 & 0xffffffff;
            uVar13 = local_4518;
            do {
              if ((int)uVar13 < 1) {
                uVar8 = (uint)local_4508;
                break;
              }
              uVar8 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar8;
              lVar12 = uVar13 * 2;
              uVar13 = uVar13 - 1;
            } while (count_buf_8bit[lVar12 + -1] < iVar7);
            lVar12 = (long)(int)uVar8;
            memmove(count_buf_8bit + lVar12 * 2 + 2,count_buf_8bit + lVar12 * 2,
                    (long)(int)(~uVar8 + iVar10) << 3);
            count_buf_8bit[lVar12 * 2] = (int)uVar14;
            count_buf_8bit[lVar12 * 2 + 1] = iVar7;
            uVar13 = local_4500;
            uVar18 = local_44f8;
            cpi = local_4528;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
    }
    if (0 < (int)local_44a0) {
      uVar13 = 0;
      do {
        top_colors[uVar13] = (int16_t)count_buf_8bit[uVar13 * 2];
        uVar13 = uVar13 + 1;
      } while ((uVar18 & 0xffffffff) != uVar13);
    }
    local_44f8 = CONCAT44(local_44f8._4_4_,(cpi->sf).intra_sf.prune_luma_palette_size_search_level);
    sVar6 = (short)uVar21;
    if (colors < 3 || (cpi->sf).intra_sf.prune_palette_search_level != 1) {
      local_4508 = 8;
      if (colors < 8) {
        local_4508 = (ulong)(uint)colors;
      }
      uVar18 = 2;
      local_4500 = CONCAT44(local_4500._4_4_,local_4480) & 0xffffffff000000ff;
      iVar7 = colors;
      if (1 < colors) {
        local_4518 = CONCAT44(local_4518._4_4_,colors);
        local_44f0 = (ulong)((int)local_4508 + 1);
        sVar19 = 4;
        uVar13 = 2;
        do {
          uVar18 = uVar13;
          bVar23 = (int)local_44f8 != 0;
          beat_best_palette_rd = 0;
          local_4531 = false;
          memcpy(count_buf_8bit,top_colors,sVar19);
          palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,local_44e8
                       ,(int16_t *)count_buf_8bit,(int)uVar18,color_cache,(int)local_44c0,bVar23,
                       local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4531,
                       (int)local_44b8);
          if (local_4531 != false) goto LAB_001e1c7f;
          if ((beat_best_palette_rd == 0) &&
             ((local_4528->sf).intra_sf.prune_palette_search_level == 2)) break;
          sVar19 = sVar19 + 2;
          uVar13 = uVar18 + 1;
        } while (local_44f0 != uVar18 + 1);
        cpi = local_4528;
        iVar7 = (uint)local_4518;
      }
      iVar11 = (int)local_4510;
      if ((int)uVar18 < (int)local_4508) {
        local_4518 = CONCAT44(local_4518._4_4_,iVar7);
        lVar12 = (long)(int)local_4508;
        local_44f0 = (ulong)(int)uVar18;
        sVar19 = lVar12 * 2;
        do {
          beat_best_palette_rd = 0;
          local_4531 = false;
          memcpy(count_buf_8bit,top_colors,sVar19);
          palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,local_44e8
                       ,(int16_t *)count_buf_8bit,(int)lVar12,color_cache,(int)local_44c0,false,
                       local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4531,
                       (int)local_44b8);
          if ((local_4531 != false) ||
             ((beat_best_palette_rd == 0 &&
              ((local_4528->sf).intra_sf.prune_palette_search_level == 2)))) break;
          lVar12 = lVar12 + -1;
          sVar19 = sVar19 - 2;
        } while ((long)local_44f0 < lVar12);
LAB_001e1c7f:
        cpi = local_4528;
        iVar7 = (uint)local_4518;
        iVar11 = (int)local_4510;
      }
      piVar17 = local_44e8;
      if (colors == 2) {
        count_buf_8bit[0]._2_2_ = (short)uVar15;
        count_buf_8bit[0]._0_2_ = sVar6;
        palette_rd_y(cpi,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,local_44e8,
                     (int16_t *)count_buf_8bit,2,color_cache,(int)local_44c0,false,local_44d8,
                     local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,
                     best_blk_skip,tx_type_map,(int *)0x0,(_Bool *)0x0,(int)local_44b8);
        x = local_44d0;
      }
      else {
        local_452c = local_452c * iVar11;
        iVar11 = 2;
        if (1 < iVar7) {
          local_4518 = CONCAT44(local_4518._4_4_,uVar15 - uVar21);
          local_44a0 = (ulong)((int)local_4508 + 1);
          local_44a8 = CONCAT44(local_44a8._4_4_,uVar15 * 3 + uVar21 * -3);
          iVar7 = uVar15 * 4 + uVar21 * -4;
          uVar18 = 2;
          uVar13 = 3;
          do {
            beat_best_palette_rd = 0;
            local_4531 = false;
            iVar11 = (int)uVar18;
            lVar12 = uVar18 - 1;
            auVar24._8_4_ = (int)lVar12;
            auVar24._0_8_ = lVar12;
            auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar24 = auVar24 ^ _DAT_004cf6f0;
            uVar14 = 0;
            auVar31 = _DAT_004cf6e0;
            iVar10 = (uint)local_4518;
            iVar16 = (int)local_44a8;
            do {
              auVar30 = auVar31 ^ _DAT_004cf6f0;
              if ((bool)(~(auVar30._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar30._0_4_ ||
                          auVar24._4_4_ < auVar30._4_4_) & 1)) {
                *(short *)((long)count_buf_8bit + uVar14) =
                     (short)(((uint)((ulong)((long)iVar10 / (long)iVar11) >> 0x1f) & 1) +
                             (int)((long)iVar10 / (long)iVar11) >> 1) + sVar6;
              }
              if ((auVar30._12_4_ != auVar24._12_4_ || auVar30._8_4_ <= auVar24._8_4_) &&
                  auVar30._12_4_ <= auVar24._12_4_) {
                *(short *)((long)count_buf_8bit + uVar14 + 2) =
                     (short)(((uint)((ulong)((long)iVar16 / (long)iVar11) >> 0x1f) & 1) +
                             (int)((long)iVar16 / (long)iVar11) >> 1) + sVar6;
              }
              lVar12 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 2;
              auVar31._8_8_ = lVar12 + 2;
              uVar14 = uVar14 + 4;
              iVar16 = iVar16 + iVar7;
              iVar10 = iVar10 + iVar7;
            } while ((uVar13 * 2 & 0xfffffffffffffffc) != uVar14);
            bVar23 = (int)local_44f8 != 0;
            local_4510 = uVar18;
            local_44f0 = uVar13;
            av1_k_means_dim1(piVar17,(int16_t *)count_buf_8bit,local_4488,local_452c,iVar11,0x32);
            palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,piVar17,
                         (int16_t *)count_buf_8bit,iVar11,color_cache,(int)local_44c0,bVar23,
                         local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                         beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,
                         &local_4531,(int)local_44b8);
            x = local_44d0;
            if (local_4531 != false) goto LAB_001e28fb;
            if ((beat_best_palette_rd == 0) &&
               ((local_4528->sf).intra_sf.prune_palette_search_level == 2)) break;
            uVar18 = local_4510 + 1;
            uVar13 = local_44f0 + 1;
          } while (uVar18 != local_44a0);
        }
        piVar17 = local_44e8;
        x = local_44d0;
        if (iVar11 < (int)local_4508) {
          local_4510 = CONCAT44(local_4510._4_4_,uVar15 - uVar21);
          local_44f0 = (ulong)iVar11;
          uVar18 = (local_4508 & 0xffffffff) + 1;
          local_44f8 = CONCAT44(local_44f8._4_4_,uVar15 * 3 + uVar21 * -3);
          iVar7 = uVar15 * 4 + uVar21 * -4;
          uVar13 = local_4508 & 0xffffffff;
          do {
            beat_best_palette_rd = 0;
            local_4531 = false;
            uVar20 = uVar13 - 1;
            auVar27._8_4_ = (int)uVar20;
            auVar27._0_8_ = uVar20;
            auVar27._12_4_ = (int)(uVar20 >> 0x20);
            auVar27 = auVar27 ^ _DAT_004cf6f0;
            uVar14 = 0;
            auVar30 = _DAT_004cf6e0;
            iVar11 = (int)local_4510;
            iVar10 = (int)local_44f8;
            do {
              auVar31 = auVar30 ^ _DAT_004cf6f0;
              iVar16 = (int)uVar13;
              if ((bool)(~(auVar31._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar31._0_4_ ||
                          auVar27._4_4_ < auVar31._4_4_) & 1)) {
                *(short *)((long)count_buf_8bit + uVar14 * 2) =
                     (short)(((uint)((ulong)((long)iVar11 / (long)iVar16) >> 0x1f) & 1) +
                             (int)((long)iVar11 / (long)iVar16) >> 1) + sVar6;
              }
              if ((auVar31._12_4_ != auVar27._12_4_ || auVar31._8_4_ <= auVar27._8_4_) &&
                  auVar31._12_4_ <= auVar27._12_4_) {
                *(short *)((long)count_buf_8bit + uVar14 * 2 + 2) =
                     (short)(((uint)((ulong)((long)iVar10 / (long)iVar16) >> 0x1f) & 1) +
                             (int)((long)iVar10 / (long)iVar16) >> 1) + sVar6;
              }
              uVar14 = uVar14 + 2;
              lVar12 = auVar30._8_8_;
              auVar30._0_8_ = auVar30._0_8_ + 2;
              auVar30._8_8_ = lVar12 + 2;
              iVar10 = iVar10 + iVar7;
              iVar11 = iVar11 + iVar7;
            } while ((uVar18 & 0xfffffffffffffffe) != uVar14);
            av1_k_means_dim1(piVar17,(int16_t *)count_buf_8bit,local_4488,local_452c,iVar16,0x32);
            palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,piVar17,
                         (int16_t *)count_buf_8bit,iVar16,color_cache,(int)local_44c0,false,
                         local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                         beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,
                         &local_4531,(int)local_44b8);
            x = local_44d0;
          } while ((local_4531 == false) &&
                  (((beat_best_palette_rd != 0 ||
                    ((local_4528->sf).intra_sf.prune_palette_search_level != 2)) &&
                   (uVar18 = uVar18 - 1, uVar13 = uVar20, (long)local_44f0 < (long)uVar20))));
        }
      }
    }
    else {
      uVar18 = 8;
      if ((uint)colors < 8) {
        uVar18 = (ulong)(uint)colors;
      }
      bVar22 = (&DAT_004e35e6)[uVar18];
      uVar13 = (ulong)bVar22;
      x = local_44d0;
      if ((uint)bVar22 <= (uint)uVar18) {
        local_44f0 = (ulong)(byte)(&DAT_004e35ef)[uVar18];
        local_4518._0_4_ = (uint)uVar18 + 1;
        local_4508 = (ulong)(uint)local_4518;
        sVar19 = (size_t)((uint)bVar22 + (uint)bVar22);
        local_4490 = (ulong)((uint)(byte)(&DAT_004e35ef)[uVar18] * 2);
        local_4500 = CONCAT44(local_4500._4_4_,local_4480) & 0xffffffff000000ff;
        local_44a8 = CONCAT44(local_44a8._4_4_,(uint)local_4518);
        uVar14 = uVar13;
        local_44a0 = uVar18;
        do {
          bVar23 = (int)local_44f8 != 0;
          beat_best_palette_rd = 0;
          local_4531 = false;
          memcpy(count_buf_8bit,top_colors,sVar19);
          palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,local_44e8
                       ,(int16_t *)count_buf_8bit,(uint)uVar14,color_cache,(int)local_44c0,bVar23,
                       local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4531,
                       (int)local_44b8);
          if ((local_4531 != false) ||
             ((uVar8 = (uint)uVar14, beat_best_palette_rd == 0 &&
              (uVar8 = (uint)local_4518, (local_4528->sf).intra_sf.prune_palette_search_level == 2))
             )) break;
          local_4518._0_4_ = uVar8;
          uVar14 = uVar14 + local_44f0;
          sVar19 = sVar19 + local_4490;
        } while (uVar14 < local_4508);
        uVar8 = (uint)local_44a0;
        if ((int)(uint)local_4518 <= (int)uVar8) {
          uVar9 = 3;
          if (3 < (int)(uint)local_4518) {
            uVar9 = (uint)local_4518;
          }
          uVar9 = uVar9 - 1;
          if ((uint)local_4518 == 2) {
            uVar9 = 3;
          }
          if ((uint)local_4518 == uVar8) {
            iVar7 = uVar8 - 1;
          }
          else {
            uVar8 = 7;
            if ((int)(uint)local_4518 < 7) {
              uVar8 = (uint)local_4518;
            }
            iVar7 = uVar8 + 1;
          }
          if ((int)uVar9 <= iVar7) {
            local_4518 = (ulong)(iVar7 + 1);
            local_4508 = 1;
            if (1 < (int)(iVar7 - uVar9)) {
              local_4508 = (ulong)(iVar7 - uVar9);
            }
            uVar18 = (ulong)uVar9;
            sVar19 = uVar18 * 2;
            local_4490 = (ulong)(uint)((int)local_4508 * 2);
            do {
              beat_best_palette_rd = 0;
              local_4531 = false;
              memcpy(count_buf_8bit,top_colors,sVar19);
              palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,
                           local_44e8,(int16_t *)count_buf_8bit,(int)uVar18,color_cache,
                           (int)local_44c0,false,local_44d8,local_44c8,best_rd,rate,rate_tokenonly,
                           distortion,skippable,beat_best_rd,ctx,best_blk_skip,tx_type_map,
                           &beat_best_palette_rd,&local_4531,(int)local_44b8);
              if ((local_4531 != false) ||
                 ((beat_best_palette_rd == 0 &&
                  ((local_4528->sf).intra_sf.prune_palette_search_level == 2)))) break;
              uVar18 = uVar18 + local_4508;
              sVar19 = sVar19 + local_4490;
            } while (uVar18 < local_4518);
          }
        }
        local_452c = local_452c * (int)local_4510;
        local_4508 = CONCAT44(local_4508._4_4_,uVar15 - uVar21);
        uVar18 = uVar13 + 1;
        local_4490 = CONCAT44(local_4490._4_4_,uVar15 * 3 + uVar21 * -3);
        iVar7 = uVar15 * 4 + uVar21 * -4;
        do {
          piVar17 = local_44e8;
          beat_best_palette_rd = 0;
          local_4531 = false;
          iVar11 = 0;
          if (uVar13 != 0) {
            lVar12 = uVar13 - 1;
            auVar25._8_4_ = (int)lVar12;
            auVar25._0_8_ = lVar12;
            auVar25._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar25 = auVar25 ^ _DAT_004cf6f0;
            uVar14 = 0;
            auVar28 = _DAT_004cf6e0;
            iVar10 = (uint)local_4508;
            iVar16 = (int)local_4490;
            do {
              auVar31 = auVar28 ^ _DAT_004cf6f0;
              iVar11 = (int)uVar13;
              if ((bool)(~(auVar25._4_4_ < auVar31._4_4_ ||
                          auVar25._0_4_ < auVar31._0_4_ && auVar31._4_4_ == auVar25._4_4_) & 1)) {
                *(short *)((long)count_buf_8bit + uVar14 * 2) =
                     (short)(((uint)((ulong)((long)iVar10 / (long)iVar11) >> 0x1f) & 1) +
                             (int)((long)iVar10 / (long)iVar11) >> 1) + sVar6;
              }
              if (auVar31._12_4_ <= auVar25._12_4_ &&
                  (auVar31._8_4_ <= auVar25._8_4_ || auVar31._12_4_ != auVar25._12_4_)) {
                *(short *)((long)count_buf_8bit + uVar14 * 2 + 2) =
                     (short)(((uint)((ulong)((long)iVar16 / (long)iVar11) >> 0x1f) & 1) +
                             (int)((long)iVar16 / (long)iVar11) >> 1) + sVar6;
              }
              uVar14 = uVar14 + 2;
              lVar12 = auVar28._8_8_;
              auVar28._0_8_ = auVar28._0_8_ + 2;
              auVar28._8_8_ = lVar12 + 2;
              iVar16 = iVar16 + iVar7;
              iVar10 = iVar10 + iVar7;
            } while ((uVar18 & 0xfffffffffffffffe) != uVar14);
          }
          local_4510 = (ulong)((int)local_44f8 != 0);
          local_4518 = uVar18;
          av1_k_means_dim1(local_44e8,(int16_t *)count_buf_8bit,local_4488,local_452c,iVar11,0x32);
          palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,piVar17,
                       (int16_t *)count_buf_8bit,iVar11,color_cache,(int)local_44c0,
                       SUB81(local_4510,0),local_44d8,local_44c8,best_rd,rate,rate_tokenonly,
                       distortion,skippable,beat_best_rd,ctx,best_blk_skip,tx_type_map,
                       &beat_best_palette_rd,&local_4531,(int)local_44b8);
          piVar17 = local_44e8;
          iVar10 = (int)local_44a8;
          if ((local_4531 != false) ||
             ((iVar10 = iVar11, beat_best_palette_rd == 0 &&
              (iVar10 = (int)local_44a8, (local_4528->sf).intra_sf.prune_palette_search_level == 2))
             )) break;
          uVar13 = uVar13 + local_44f0;
          uVar18 = local_4518 + local_44f0;
          local_44a8 = CONCAT44(local_44a8._4_4_,iVar10);
        } while (uVar13 <= local_44a0);
        iVar11 = (int)local_44a0;
        x = local_44d0;
        if (iVar10 <= iVar11) {
          iVar16 = 3;
          if (3 < iVar10) {
            iVar16 = iVar10;
          }
          uVar8 = iVar16 - 1;
          if (iVar10 == 2) {
            uVar8 = 3;
          }
          if (iVar10 == iVar11) {
            iVar11 = iVar11 + -1;
          }
          else {
            iVar11 = 7;
            if (iVar10 < 7) {
              iVar11 = iVar10;
            }
            iVar11 = iVar11 + 1;
          }
          iVar10 = 1;
          if (1 < (int)(iVar11 - uVar8)) {
            iVar10 = iVar11 - uVar8;
          }
          local_4510 = CONCAT44(local_4510._4_4_,iVar10);
          if ((int)uVar8 <= iVar11) {
            local_44f8 = CONCAT44(local_44f8._4_4_,uVar15 * 3 + uVar21 * -3);
            do {
              beat_best_palette_rd = 0;
              local_4531 = false;
              if (0 < (int)uVar8) {
                lVar12 = (ulong)uVar8 - 1;
                auVar26._8_4_ = (int)lVar12;
                auVar26._0_8_ = lVar12;
                auVar26._12_4_ = (int)((ulong)lVar12 >> 0x20);
                auVar26 = auVar26 ^ _DAT_004cf6f0;
                uVar18 = 0;
                auVar29 = _DAT_004cf6e0;
                iVar10 = (uint)local_4508;
                iVar16 = (int)local_44f8;
                do {
                  auVar31 = auVar29 ^ _DAT_004cf6f0;
                  if ((bool)(~(auVar26._4_4_ < auVar31._4_4_ ||
                              auVar26._0_4_ < auVar31._0_4_ && auVar31._4_4_ == auVar26._4_4_) & 1))
                  {
                    *(short *)((long)count_buf_8bit + uVar18 * 2) =
                         (short)(((uint)((ulong)((long)iVar10 / (long)(int)uVar8) >> 0x1f) & 1) +
                                 (int)((long)iVar10 / (long)(int)uVar8) >> 1) + sVar6;
                  }
                  if (auVar31._12_4_ <= auVar26._12_4_ &&
                      (auVar31._8_4_ <= auVar26._8_4_ || auVar31._12_4_ != auVar26._12_4_)) {
                    *(short *)((long)count_buf_8bit + uVar18 * 2 + 2) =
                         (short)(((uint)((ulong)((long)iVar16 / (long)(int)uVar8) >> 0x1f) & 1) +
                                 (int)((long)iVar16 / (long)(int)uVar8) >> 1) + sVar6;
                  }
                  uVar18 = uVar18 + 2;
                  lVar12 = auVar29._8_8_;
                  auVar29._0_8_ = auVar29._0_8_ + 2;
                  auVar29._8_8_ = lVar12 + 2;
                  iVar16 = iVar16 + iVar7;
                  iVar10 = iVar10 + iVar7;
                } while ((uVar8 + 1 & 0xfffffffe) != uVar18);
              }
              av1_k_means_dim1(piVar17,(int16_t *)count_buf_8bit,local_4488,local_452c,uVar8,0x32);
              palette_rd_y(local_4528,local_44d0,local_44e0,(BLOCK_SIZE)local_4500,local_451c,
                           piVar17,(int16_t *)count_buf_8bit,uVar8,color_cache,(int)local_44c0,false
                           ,local_44d8,local_44c8,best_rd,rate,rate_tokenonly,distortion,skippable,
                           beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,
                           &local_4531,(int)local_44b8);
              x = local_44d0;
              if ((local_4531 != false) ||
                 ((beat_best_palette_rd == 0 &&
                  ((local_4528->sf).intra_sf.prune_palette_search_level == 2)))) break;
              uVar8 = uVar8 + (int)local_4510;
            } while ((int)uVar8 <= iVar11);
          }
        }
      }
    }
  }
LAB_001e28fb:
  if ((local_44d8->palette_mode_info).palette_size[0] != '\0') {
    uVar21 = (bVar1 >> (bVar2 & 0x1f)) * local_447c;
    memcpy(local_4488,local_44c8,(ulong)uVar21);
    x->palette_pixels = x->palette_pixels + uVar21;
  }
  memcpy(local_44e0,local_44d8,0xb0);
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sby(
    const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, int dc_mode_cost,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *best_blk_skip,
    uint8_t *tx_type_map) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           bsize));
  assert(PALETTE_MAX_SIZE == 8);
  assert(PALETTE_MIN_SIZE == 2);

  const int src_stride = x->plane[0].src.stride;
  const uint8_t *const src = x->plane[0].src.buf;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  const int is_hbd = seq_params->use_highbitdepth;
  const int bit_depth = seq_params->bit_depth;
  const int discount_color_cost = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int unused;

  int count_buf[1 << 12];  // Maximum (1 << 12) color levels.
  int colors, colors_threshold = 0;
  if (is_hbd) {
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src, src_stride, rows, cols, bit_depth, count_buf,
                            count_buf_8bit, &colors_threshold, &colors);
  } else {
    av1_count_colors(src, src_stride, rows, cols, count_buf, &colors);
    colors_threshold = colors;
  }

  uint8_t *const color_map = xd->plane[0].color_index_map;
  int color_thresh_palette = x->color_palette_thresh;
  // Allow for larger color_threshold for palette search, based on color,
  // scene_change, and block source variance.
  // Since palette is Y based, only allow larger threshold if block
  // color_dist is below threshold.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      cpi->sf.rt_sf.increase_color_thresh_palette && cpi->rc.high_source_sad &&
      x->source_variance > 50) {
    int64_t norm_color_dist = 0;
    if (x->color_sensitivity[0] || x->color_sensitivity[1]) {
      norm_color_dist = x->min_dist_inter_uv >>
                        (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
      if (x->color_sensitivity[0] && x->color_sensitivity[1])
        norm_color_dist = norm_color_dist >> 1;
    }
    if (norm_color_dist < 8000) color_thresh_palette += 20;
  }
  if (colors_threshold > 1 && colors_threshold <= color_thresh_palette) {
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[PALETTE_MAX_SIZE];
    int lower_bound, upper_bound;
    fill_data_and_get_bounds(src, src_stride, rows, cols, is_hbd, data,
                             &lower_bound, &upper_bound);

    mbmi->mode = DC_PRED;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;

    uint16_t color_cache[2 * PALETTE_MAX_SIZE];
    const int n_cache = av1_get_palette_cache(xd, 0, color_cache);

    // Find the dominant colors, stored in top_colors[].
    int16_t top_colors[PALETTE_MAX_SIZE] = { 0 };
    find_top_colors(count_buf, bit_depth, AOMMIN(colors, PALETTE_MAX_SIZE),
                    top_colors);

    // The following are the approaches used for header rdcost based gating
    // for early termination for different values of prune_palette_search_level.
    // 0: Pruning based on header rdcost for ascending order palette_size
    // search.
    // 1: When colors > PALETTE_MIN_SIZE, enabled only for coarse palette_size
    // search and for finer search do_header_rd_based_gating parameter is
    // explicitly passed as 'false'.
    // 2: Enabled only for ascending order palette_size search and for
    // descending order search do_header_rd_based_gating parameter is explicitly
    // passed as 'false'.
    const bool do_header_rd_based_gating =
        cpi->sf.intra_sf.prune_luma_palette_size_search_level != 0;

    // TODO(huisu@google.com): Try to avoid duplicate computation in cases
    // where the dominant colors and the k-means results are similar.
    if ((cpi->sf.intra_sf.prune_palette_search_level == 1) &&
        (colors > PALETTE_MIN_SIZE)) {
      // Start index and step size below are chosen to evaluate unique
      // candidates in neighbor search, in case a winner candidate is found in
      // coarse search. Example,
      // 1) 8 colors (end_n = 8): 2,3,4,5,6,7,8. start_n is chosen as 2 and step
      // size is chosen as 3. Therefore, coarse search will evaluate 2, 5 and 8.
      // If winner is found at 5, then 4 and 6 are evaluated. Similarly, for 2
      // (3) and 8 (7).
      // 2) 7 colors (end_n = 7): 2,3,4,5,6,7. If start_n is chosen as 2 (same
      // as for 8 colors) then step size should also be 2, to cover all
      // candidates. Coarse search will evaluate 2, 4 and 6. If winner is either
      // 2 or 4, 3 will be evaluated. Instead, if start_n=3 and step_size=3,
      // coarse search will evaluate 3 and 6. For the winner, unique neighbors
      // (3: 2,4 or 6: 5,7) would be evaluated.

      // Start index for coarse palette search for dominant colors and k-means
      const uint8_t start_n_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                   3, 3, 2,
                                                                   3, 3, 2 };
      // Step size for coarse palette search for dominant colors and k-means
      const uint8_t step_size_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                     3, 3, 3,
                                                                     3, 3, 3 };

      // Choose the start index and step size for coarse search based on number
      // of colors
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE);
      const int min_n = start_n_lookup_table[max_n];
      const int step_size = step_size_lookup_table[max_n];
      assert(min_n >= PALETTE_MIN_SIZE);
      // Perform top color coarse palette search to find the winner candidate
      const int top_color_winner = perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          step_size, do_header_rd_based_gating, &unused, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for dominant colors
      if (top_color_winner <= max_n) {
        int stage2_min_n, stage2_max_n, stage2_step_size;
        set_stage2_params(&stage2_min_n, &stage2_max_n, &stage2_step_size,
                          top_color_winner, max_n);
        // perform finer search for the winner candidate
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, stage2_min_n,
            stage2_max_n + 1, stage2_step_size,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      // Perform k-means coarse palette search to find the winner candidate
      const int k_means_winner = perform_k_means_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
          min_n, max_n + 1, step_size, do_header_rd_based_gating, &unused,
          color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
          rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
          best_blk_skip, tx_type_map, color_map, rows * cols,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for k-means
      if (k_means_winner <= max_n) {
        int start_n_stage2, end_n_stage2, step_size_stage2;
        set_stage2_params(&start_n_stage2, &end_n_stage2, &step_size_stage2,
                          k_means_winner, max_n);
        // perform finer search for the winner candidate
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            start_n_stage2, end_n_stage2 + 1, step_size_stage2,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, color_map, rows * cols, discount_color_cost);
      }
    } else {
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE),
                min_n = PALETTE_MIN_SIZE;
      // Perform top color palette search in ascending order
      int last_n_searched = min_n;
      perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          1, do_header_rd_based_gating, &last_n_searched, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      if (last_n_searched < max_n) {
        // Search in descending order until we get to the previous best
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, max_n,
            last_n_searched, -1, /*do_header_rd_based_gating=*/false, &unused,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      if (colors == PALETTE_MIN_SIZE) {
        // Special case: These colors automatically become the centroids.
        assert(colors == 2);
        centroids[0] = lower_bound;
        centroids[1] = upper_bound;
        palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, colors,
                     color_cache, n_cache, /*do_header_rd_based_gating=*/false,
                     best_mbmi, best_palette_color_map, best_rd, rate,
                     rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
                     best_blk_skip, tx_type_map, NULL, NULL,
                     discount_color_cost);
      } else {
        // Perform k-means palette search in ascending order
        last_n_searched = min_n;
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            min_n, max_n + 1, 1, do_header_rd_based_gating, &last_n_searched,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, color_map, rows * cols,
            discount_color_cost);
        if (last_n_searched < max_n) {
          // Search in descending order until we get to the previous best
          perform_k_means_palette_search(
              cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
              max_n, last_n_searched, -1, /*do_header_rd_based_gating=*/false,
              &unused, color_cache, n_cache, best_mbmi, best_palette_color_map,
              best_rd, rate, rate_tokenonly, distortion, skippable,
              beat_best_rd, ctx, best_blk_skip, tx_type_map, color_map,
              rows * cols, discount_color_cost);
        }
      }
    }
  }

  if (best_mbmi->palette_mode_info.palette_size[0] > 0) {
    memcpy(color_map, best_palette_color_map,
           block_width * block_height * sizeof(best_palette_color_map[0]));
    // Gather the stats to determine whether to use screen content tools in
    // function av1_determine_sc_tools_with_encoding().
    x->palette_pixels += (block_width * block_height);
  }
  *mbmi = *best_mbmi;
}